

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

cf_errno_t cf_thread_join(cf_thread_t t,cf_uint32_t *retval)

{
  int iVar1;
  cf_errno_t cVar2;
  cf_void_t *ret;
  void *local_10;
  
  local_10 = (void *)0x0;
  iVar1 = pthread_join(t,&local_10);
  cVar2 = 1;
  if (iVar1 == 0) {
    cVar2 = 0;
    if (retval != (cf_uint32_t *)0x0) {
      *retval = (cf_uint32_t)local_10;
      cVar2 = 0;
    }
  }
  return cVar2;
}

Assistant:

cf_errno_t cf_thread_join(cf_thread_t t, cf_uint32_t* retval) {
#ifdef CF_OS_WIN
    DWORD retval_dw = 0;
    cf_uint32_t ret = WaitForSingleObject(t, INFINITE);
    if(retval) {
        (cf_void_t)GetExitCodeThread(t, &retval_dw);
        *retval = retval_dw;
    }
    if (WAIT_OBJECT_0 == ret) return CF_OK;
    else return CF_NOK;
#else
    cf_void_t* ret = 0;
    if(pthread_join(t, &ret) == 0) {
        if(retval) *retval = (cf_uint32_t)(cf_uintptr_t)ret;
        return CF_OK;
    }
    else return CF_NOK;
#endif
}